

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&,std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&,std::vector<std::vector<Link,std::allocator<Link>>,std::allocator<std::vector<Link,std::allocator<Link>>>>const&>
           *this,long call)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  return bVar2 && bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }